

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YeeGridTests.cpp
# Opt level: O0

void __thiscall YeeGridTest2d::SetUp(YeeGridTest2d *this)

{
  PositionType *in_RDI;
  IndexType *in_stack_ffffffffffffff88;
  PositionType *origin;
  double *this_00;
  Vector2<int> local_30;
  Vector2<double> local_28;
  Vector2<double> local_18;
  
  pica::Vector2<double>::Vector2(&local_18,3.5,-8.6);
  this_00 = &in_RDI[1].y;
  in_RDI[1].y = local_18.x;
  in_RDI[2].x = local_18.y;
  pica::Vector2<double>::Vector2(&local_28,0.1,0.2);
  in_RDI[2].y = local_28.x;
  in_RDI[3].x = local_28.y;
  pica::Vector2<int>::Vector2(&local_30,5,6);
  in_RDI[3].y = (double)local_30;
  origin = in_RDI + 1;
  operator_new(0x140);
  pica::YeeGrid<(pica::Dimension)2,_double>::YeeGrid
            ((YeeGrid<(pica::Dimension)2,_double> *)this_00,origin,in_RDI,in_stack_ffffffffffffff88)
  ;
  std::auto_ptr<pica::YeeGrid<(pica::Dimension)2,_double>_>::reset
            ((auto_ptr<pica::YeeGrid<(pica::Dimension)2,_double>_> *)this_00,(element_type *)origin)
  ;
  return;
}

Assistant:

virtual void SetUp()
    {
        origin = PositionType(3.5, -8.6);
        step = PositionType(0.1, 0.2);
        size = IndexType(5, 6);
        grid.reset(new GridType(origin, step, size));
    }